

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_add_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint *pmVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong *puVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  size_t nblimbs;
  ulong uVar9;
  bool bVar10;
  
  bVar10 = X == B;
  if (bVar10) {
    B = A;
  }
  if ((A == X || bVar10) || (iVar3 = mbedtls_mpi_copy(X,A), iVar3 == 0)) {
    X->s = 1;
    nblimbs = B->n;
    if (nblimbs != 0) {
      do {
        if (B->p[nblimbs - 1] != 0) goto LAB_00185db5;
        nblimbs = nblimbs - 1;
      } while (nblimbs != 0);
    }
    nblimbs = 0;
LAB_00185db5:
    iVar3 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar3 == 0) {
      if (nblimbs == 0) {
        iVar3 = 0;
      }
      else {
        puVar5 = X->p;
        pmVar1 = B->p;
        uVar9 = 0;
        sVar6 = 0;
        do {
          uVar2 = *puVar5;
          uVar7 = uVar9 + uVar2;
          *puVar5 = uVar7;
          uVar7 = uVar7 + pmVar1[sVar6];
          *puVar5 = uVar7;
          uVar9 = (ulong)(uVar7 < pmVar1[sVar6]) + (ulong)CARRY8(uVar9,uVar2);
          sVar6 = sVar6 + 1;
          puVar5 = puVar5 + 1;
        } while (nblimbs != sVar6);
        iVar3 = 0;
        if (uVar9 != 0) {
          lVar8 = nblimbs * 8;
          do {
            if (X->n <= nblimbs) {
              iVar4 = mbedtls_mpi_grow(X,nblimbs + 1);
              if (iVar4 != 0) {
                return iVar4;
              }
              puVar5 = (ulong *)((long)X->p + lVar8);
            }
            lVar8 = lVar8 + 8;
            bVar10 = CARRY8(*puVar5,uVar9);
            *puVar5 = *puVar5 + uVar9;
            puVar5 = puVar5 + 1;
            uVar9 = 1;
            nblimbs = nblimbs + 1;
          } while (bVar10);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_add_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t i, j;
    mbedtls_mpi_uint *o, *p, c;

    if( X == B )
    {
        const mbedtls_mpi *T = A; A = X; B = T;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned additions.
     */
    X->s = 1;

    for( j = B->n; j > 0; j-- )
        if( B->p[j - 1] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, j ) );

    o = B->p; p = X->p; c = 0;

    for( i = 0; i < j; i++, o++, p++ )
    {
        *p +=  c; c  = ( *p <  c );
        *p += *o; c += ( *p < *o );
    }

    while( c != 0 )
    {
        if( i >= X->n )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i + 1 ) );
            p = X->p + i;
        }

        *p += c; c = ( *p < c ); i++; p++;
    }

cleanup:

    return( ret );
}